

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O3

void __thiscall cashew::JSPrinter::printObject(JSPrinter *this,Ref node)

{
  size_t sVar1;
  bool bVar2;
  undefined1 uVar3;
  char cVar4;
  uint uVar5;
  int iVar6;
  undefined8 *puVar7;
  Ref *pRVar8;
  char *s;
  Value *pVVar9;
  uint uVar10;
  ulong uVar11;
  Value *local_58;
  Ref node_local;
  int *local_48;
  Ref args;
  
  local_58 = node.inst;
  maybeSpace(this,'{');
  ensure(this,1);
  sVar1 = this->used;
  this->used = sVar1 + 1;
  this->buffer[sVar1] = '{';
  this->indent = this->indent + 1;
  newline(this);
  puVar7 = (undefined8 *)cashew::Ref::operator[]((uint)&local_58);
  local_48 = (int *)*puVar7;
  if (*local_48 == 2) {
    uVar11 = 0;
    do {
      if (*(ulong *)(*(long *)(local_48 + 2) + 8) <= uVar11) {
        this->indent = this->indent + -1;
        newline(this);
        emit(this,'}');
        return;
      }
      if (uVar11 != 0) {
        if (this->pretty == true) {
          emit(this,", ");
        }
        else {
          maybeSpace(this,',');
          ensure(this,1);
          sVar1 = this->used;
          this->used = sVar1 + 1;
          this->buffer[sVar1] = ',';
        }
        newline(this);
      }
      uVar10 = (uint)&local_48;
      uVar5 = cashew::Ref::operator[](uVar10);
      puVar7 = (undefined8 *)cashew::Ref::operator[](uVar5);
      iVar6 = *(int *)*puVar7;
      uVar5 = cashew::Ref::operator[](uVar10);
      puVar7 = (undefined8 *)cashew::Ref::operator[](uVar5);
      if (iVar6 == 2) {
        pRVar8 = (Ref *)cashew::Ref::operator[]((uint)puVar7);
        cVar4 = cashew::Ref::operator==(pRVar8,(IString *)&STRING);
        uVar5 = cashew::Ref::operator[](uVar10);
        uVar5 = cashew::Ref::operator[](uVar5);
        if (cVar4 != '\0') {
          puVar7 = (undefined8 *)cashew::Ref::operator[](uVar5);
          if (*(int *)*puVar7 != 0) goto LAB_00177157;
          pVVar9 = *(Value **)((int *)*puVar7 + 4);
          bVar2 = true;
          goto LAB_00176e5c;
        }
        pRVar8 = (Ref *)cashew::Ref::operator[](uVar5);
        cVar4 = cashew::Ref::operator==(pRVar8,(IString *)&GETTER);
        s = _finalize;
        if (cVar4 == '\0') {
          uVar5 = cashew::Ref::operator[](uVar10);
          uVar5 = cashew::Ref::operator[](uVar5);
          pRVar8 = (Ref *)cashew::Ref::operator[](uVar5);
          cVar4 = cashew::Ref::operator==(pRVar8,(IString *)&SETTER);
          s = ___libc_start_main;
          if (cVar4 == '\0') {
            abort();
          }
          uVar5 = cashew::Ref::operator[](uVar10);
          uVar5 = cashew::Ref::operator[](uVar5);
          puVar7 = (undefined8 *)cashew::Ref::operator[](uVar5);
          if (*(int *)*puVar7 != 0) {
LAB_00177157:
            __assert_fail("isString()",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                          ,0xeb,"const char *cashew::Value::getCString()");
          }
          pVVar9 = *(Value **)((int *)*puVar7 + 4);
          uVar5 = cashew::Ref::operator[](uVar10);
          uVar5 = cashew::Ref::operator[](uVar5);
          puVar7 = (undefined8 *)cashew::Ref::operator[](uVar5);
          if (*(int *)*puVar7 != 0) goto LAB_00177157;
          args.inst = *(Value **)((int *)*puVar7 + 4);
          bVar2 = false;
        }
        else {
          uVar5 = cashew::Ref::operator[](uVar10);
          uVar5 = cashew::Ref::operator[](uVar5);
          puVar7 = (undefined8 *)cashew::Ref::operator[](uVar5);
          if (*(int *)*puVar7 != 0) goto LAB_00177157;
          pVVar9 = *(Value **)((int *)*puVar7 + 4);
          bVar2 = false;
          args.inst = (Value *)0x0;
        }
      }
      else {
        if (*(int *)*puVar7 != 0) goto LAB_00177157;
        pVVar9 = *(Value **)((int *)*puVar7 + 4);
        bVar2 = false;
LAB_00176e5c:
        s = (char *)0x0;
        args.inst = (Value *)0x0;
      }
      uVar3 = (undefined1)pVVar9->type;
      node_local.inst = pVVar9;
      while (uVar3 != String) {
        pVVar9 = (Value *)((long)&pVVar9->type + 1);
        iVar6 = isalnum((int)(char)uVar3);
        if (((iVar6 == 0) && (uVar3 != 0x5f)) && (uVar3 != 0x24)) {
          bVar2 = true;
          break;
        }
        uVar3 = (undefined1)pVVar9->type;
      }
      if (s != (char *)0x0) {
        emit(this,s);
        space(this);
      }
      if (bVar2) {
        maybeSpace(this,'\"');
        ensure(this,1);
        sVar1 = this->used;
        this->used = sVar1 + 1;
        this->buffer[sVar1] = '\"';
        emit(this,(char *)node_local.inst);
        maybeSpace(this,'\"');
        ensure(this,1);
        sVar1 = this->used;
        this->used = sVar1 + 1;
        this->buffer[sVar1] = '\"';
      }
      else {
        emit(this,(char *)node_local.inst);
      }
      if (s == (char *)0x0) {
        emit(this,":");
      }
      else {
        maybeSpace(this,'(');
        ensure(this,1);
        sVar1 = this->used;
        this->used = sVar1 + 1;
        this->buffer[sVar1] = '(';
        if (args.inst != (Value *)0x0) {
          emit(this,(char *)args.inst);
        }
        maybeSpace(this,')');
        ensure(this,1);
        sVar1 = this->used;
        this->used = sVar1 + 1;
        this->buffer[sVar1] = ')';
      }
      space(this);
      uVar5 = cashew::Ref::operator[]((uint)&local_48);
      puVar7 = (undefined8 *)cashew::Ref::operator[](uVar5);
      print(this,(Value *)*puVar7);
      uVar11 = uVar11 + 1;
    } while (*local_48 == 2);
  }
  __assert_fail("isArray()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                ,0x199,"size_t cashew::Value::size()");
}

Assistant:

void printObject(Ref node) {
    emit('{');
    indent++;
    newline();
    Ref args = node[1];
    for (size_t i = 0; i < args->size(); i++) {
      if (i > 0) {
        pretty ? emit(", ") : emit(',');
        newline();
      }
      bool needQuote = false;
      const char* getterSetter = nullptr;
      const char* setterParam = nullptr;
      const char* str;
      if (args[i][0]->isArray()) {
        if (args[i][0][0] == STRING) {
          // A quoted string.
          needQuote = true;
          str = args[i][0][1]->getCString();
        } else if (args[i][0][0] == GETTER) {
          getterSetter = GETTER.str.data();
          str = args[i][0][1]->getCString();
        } else if (args[i][0][0] == SETTER) {
          getterSetter = SETTER.str.data();
          str = args[i][0][1]->getCString();
          setterParam = args[i][0][2]->getCString();
        } else {
          abort();
        }
      } else {
        // Just a raw string, no quotes.
        str = args[i][0]->getCString();
      }
      const char* check = str;
      while (*check) {
        if (!isalnum(*check) && *check != '_' && *check != '$') {
          needQuote = true;
          break;
        }
        check++;
      }
      if (getterSetter != nullptr) {
        emit(getterSetter);
        space();
      }
      if (needQuote) {
        emit('"');
      }
      emit(str);
      if (needQuote) {
        emit('"');
      }
      if (getterSetter != nullptr) {
        emit('(');
        if (setterParam != nullptr) {
          emit(setterParam);
        }
        emit(')');
      } else {
        emit(":");
      }
      space();
      print(args[i][1]);
    }
    indent--;
    newline();
    emit('}');
  }